

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O2

ProtoWriter * __thiscall
google::protobuf::util::converter::ProtoWriter::StartList(ProtoWriter *this,StringPiece name)

{
  string *psVar1;
  bool bVar2;
  Field *field;
  Type *type;
  stringpiece_ssize_type sVar3;
  StringPiece message;
  char *local_b0;
  undefined8 local_a8;
  AlphaNum local_80;
  string local_50;
  
  field = BeginNamed(this,name,true);
  if (field != (Field *)0x0) {
    bVar2 = ValidOneof(this,field,name);
    if (bVar2) {
      type = LookupType(this,field);
      if (type == (Type *)0x0) {
        this->invalid_depth_ = this->invalid_depth_ + 1;
        local_b0 = "Missing descriptor for field: ";
        local_a8 = 0x1e;
        psVar1 = (field->type_url_).ptr_;
        local_80.piece_data_ = (psVar1->_M_dataplus)._M_p;
        local_80.piece_size_ = psVar1->_M_string_length;
        StrCat_abi_cxx11_(&local_50,(protobuf *)&local_b0,&local_80,(AlphaNum *)local_80.piece_data_
                         );
        sVar3 = StringPiece::CheckedSsizeTFromSizeT(local_50._M_string_length);
        message.length_ = sVar3;
        message.ptr_ = local_50._M_dataplus._M_p;
        InvalidName(this,name,message);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        StartListField(this,field,type);
      }
    }
    else {
      this->invalid_depth_ = this->invalid_depth_ + 1;
    }
  }
  return this;
}

Assistant:

ProtoWriter* ProtoWriter::StartList(
    StringPiece name) {

  const google::protobuf::Field* field = BeginNamed(name, true);

  if (field == nullptr) return this;

  if (!ValidOneof(*field, name)) {
    ++invalid_depth_;
    return this;
  }

  const google::protobuf::Type* type = LookupType(field);
  if (type == nullptr) {
    ++invalid_depth_;
    InvalidName(name, StrCat("Missing descriptor for field: ",
                                   field->type_url()));
    return this;
  }

  return StartListField(*field, *type);
}